

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void * list_insert(list *list,void *data)

{
  list_item *item;
  void *data_local;
  list *list_local;
  
  list_local = (list *)malloc(0x10);
  if (list_local == (list *)0x0) {
    list_local = (list *)0x0;
  }
  else {
    list_local->tail = (list_item *)data;
    list_local->head = list->head;
    if (list->tail == (list_item *)0x0) {
      list->tail = (list_item *)list_local;
    }
    list->head = (list_item *)list_local;
  }
  return list_local;
}

Assistant:

void *list_insert(struct list *list, void *data)
{
    struct list_item *item = malloc(sizeof(struct list_item));
    if (item == NULL) {
        return NULL;
    }

    item->data = data;
    item->next = list->head;

    if (list->tail == NULL) {
        list->tail = item;
    }

    list->head = item;

    return item;
}